

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O1

bool __thiscall QColorDialogPrivate::canBeNativeDialog(QColorDialogPrivate *this)

{
  QWidget *this_00;
  char cVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *__s1;
  char *__s2;
  
  bVar2 = true;
  if ((this->super_QDialogPrivate).nativeDialogInUse == false) {
    this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
    cVar1 = QCoreApplication::testAttribute(AA_DontUseNativeDialogs);
    if (((cVar1 != '\0') ||
        (bVar2 = QWidget::testAttribute_helper(this_00,WA_DontShowOnScreen), bVar2)) ||
       (uVar4 = QColorDialogOptions::options(), (uVar4 & 4) != 0)) {
      bVar2 = false;
    }
    else {
      __s1 = (char *)QMetaObject::className();
      (*(code *)**(undefined8 **)this_00)(this_00);
      __s2 = (char *)QMetaObject::className();
      iVar3 = strcmp(__s1,__s2);
      bVar2 = iVar3 == 0;
    }
  }
  return bVar2;
}

Assistant:

bool QColorDialogPrivate::canBeNativeDialog() const
{
    // Don't use Q_Q here! This function is called from ~QDialog,
    // so Q_Q calling q_func() invokes undefined behavior (invalid cast in q_func()).
    const QDialog * const q = static_cast<const QDialog*>(q_ptr);
    if (nativeDialogInUse)
        return true;
    if (QCoreApplication::testAttribute(Qt::AA_DontUseNativeDialogs)
        || q->testAttribute(Qt::WA_DontShowOnScreen)
        || (options->options() & QColorDialog::DontUseNativeDialog)) {
        return false;
    }

    return strcmp(QColorDialog::staticMetaObject.className(), q->metaObject()->className()) == 0;
}